

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O1

void __thiscall PcodeOp::insertInput(PcodeOp *this,int4 slot)

{
  vector<Varnode_*,_std::allocator<Varnode_*>_> *this_00;
  pointer *pppVVar1;
  iterator __position;
  pointer ppVVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  Varnode *local_20;
  
  this_00 = &this->inrefs;
  local_20 = (Varnode *)0x0;
  __position._M_current =
       (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Varnode*,std::allocator<Varnode*>>::_M_realloc_insert<Varnode*>
              ((vector<Varnode*,std::allocator<Varnode*>> *)this_00,__position,&local_20);
  }
  else {
    *__position._M_current = (Varnode *)0x0;
    pppVVar1 = &(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppVVar1 = *pppVVar1 + 1;
  }
  uVar3 = (ulong)((long)(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  iVar4 = (int)uVar3 + -1;
  if (slot < iVar4) {
    uVar5 = (long)iVar4;
    do {
      ppVVar2 = (this_00->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar2[uVar5] =
           *(Varnode **)((long)ppVVar2 + ((long)((uVar3 << 0x20) + -0x200000000) >> 0x1d));
      uVar6 = uVar5 - 1;
      uVar3 = uVar5;
      uVar5 = uVar6;
    } while ((long)slot < (long)uVar6);
  }
  (this_00->super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>)._M_impl.
  super__Vector_impl_data._M_start[slot] = (Varnode *)0x0;
  return;
}

Assistant:

void PcodeOp::insertInput(int4 slot)

{
  inrefs.push_back((Varnode *)0);
  for(int4 i=inrefs.size()-1;i>slot;--i)
    inrefs[i] = inrefs[i-1];
  inrefs[slot] = (Varnode *)0;
}